

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.hpp
# Opt level: O0

void __thiscall
backend::codegen::Codegen::Codegen
          (Codegen *this,MirFunction *func,MirPackage *package,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data,bool enable_cond_exec)

{
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  Timestamp *timestamp;
  ostream *poVar4;
  size_type sVar5;
  reference ppVar6;
  Function *this_00;
  element_type *peVar7;
  size_type sVar8;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  byte in_R8B;
  pair<const_unsigned_int,_arm::ConditionCode> i;
  iterator __end3;
  iterator __begin3;
  map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
  *__range3;
  iterator inline_hint;
  pair<const_int,_mir::inst::BasicBlk> *a_1;
  iterator __end4;
  iterator __begin4;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *__range4;
  pair<const_int,_mir::inst::BasicBlk> *a;
  iterator __end5;
  iterator __begin5;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *__range5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ordering;
  iterator o;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *order_map;
  iterator any_ordering;
  key_type *in_stack_fffffffffffff598;
  Function *in_stack_fffffffffffff5a0;
  Function *this_01;
  string *in_stack_fffffffffffff5a8;
  string *name;
  Function *in_stack_fffffffffffff5b0;
  Function *in_stack_fffffffffffff5c8;
  ostream *in_stack_fffffffffffff5d0;
  allocator<char> *in_stack_fffffffffffff5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5e0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffff5e8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffff5f0;
  const_iterator in_stack_fffffffffffff5f8;
  Timestamp *in_stack_fffffffffffff628;
  ostream *in_stack_fffffffffffff630;
  ostream *in_stack_fffffffffffff698;
  ostream *in_stack_fffffffffffff6a0;
  undefined1 local_7f1 [40];
  undefined1 local_7c9 [121];
  time_point_sys_clock local_750;
  Timestamp local_748 [3];
  undefined1 local_6fa;
  allocator<char> local_6f9;
  string local_6f8 [39];
  undefined1 local_6d1 [121];
  time_point_sys_clock local_658;
  Timestamp local_650 [3];
  undefined1 local_601;
  pair<const_unsigned_int,_arm::ConditionCode> local_600;
  _Self local_5f8;
  _Self local_5f0;
  long *local_5e8;
  allocator<char> local_5d9;
  string local_5d8 [39];
  allocator<char> local_5b1;
  string local_5b0 [120];
  time_point_sys_clock local_538;
  Timestamp local_530 [3];
  undefined1 local_4e2;
  allocator<char> local_4e1;
  string local_4e0 [39];
  allocator<char> local_4b9;
  string local_4b8 [120];
  time_point_sys_clock local_440;
  Timestamp local_438 [3];
  undefined1 local_3e9;
  _Self local_3e8;
  _Self local_3e0;
  int local_3d4;
  reference local_3d0;
  _Self local_3c8;
  _Self local_3c0;
  long local_3b8;
  allocator<char> local_3a9;
  string local_3a8 [39];
  allocator<char> local_381;
  string local_380 [120];
  time_point_sys_clock local_308;
  Timestamp local_300 [3];
  undefined1 local_2b5;
  int local_2b4;
  reference local_2b0;
  _Self local_2a8;
  _Self local_2a0;
  long local_298;
  allocator<char> local_289;
  string local_288 [39];
  allocator<char> local_261;
  string local_260 [120];
  time_point_sys_clock local_1e8;
  Timestamp local_1e0 [3];
  undefined1 local_191;
  uint *local_190;
  uint *local_188;
  uint *local_180;
  uint *local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_168;
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [120];
  time_point_sys_clock local_b8;
  Timestamp local_b0 [3];
  undefined1 local_61;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
  local_60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
  local_58;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *local_50;
  _Self local_48 [3];
  _Self local_30;
  byte local_21;
  long local_10;
  
  local_21 = in_R8B & 1;
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = in_RCX;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  local_10 = in_RSI;
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::vector((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            *)0x1d2cc1);
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  std::
  map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
  ::map((map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
         *)0x1d2cf1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
         *)0x1d2d0a);
  std::
  unordered_map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::unordered_map((unordered_map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                   *)0x1d2d26);
  in_RDI[0x1d] = 0;
  in_RDI[0x1e] = 0;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1f] = 0;
  std::
  unordered_map<mir::inst::VarId,_mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  ::unordered_map((unordered_map<mir::inst::VarId,_mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                   *)0x1d2d6d);
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x22] = 0;
  in_RDI[0x23] = 0;
  in_RDI[0x20] = 0;
  in_RDI[0x21] = 0;
  in_RDI[0x26] = 0;
  std::
  unordered_map<mir::inst::VarId,_unsigned_int,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
  ::unordered_map((unordered_map<mir::inst::VarId,_unsigned_int,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
                   *)0x1d2db4);
  std::
  unordered_map<mir::inst::VarId,_unsigned_int,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
  ::unordered_map((unordered_map<mir::inst::VarId,_unsigned_int,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
                   *)0x1d2dd0);
  std::
  map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
  ::map((map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
         *)0x1d2dec);
  in_RDI[0x34] = 0;
  in_RDI[0x35] = 0;
  in_RDI[0x36] = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d2e25);
  std::
  map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
  ::map((map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
         *)0x1d2e41);
  std::optional<arm::ConditionCode>::optional((optional<arm::ConditionCode> *)0x1d2e55);
  std::optional<backend::codegen::LastJump>::optional
            ((optional<backend::codegen::LastJump> *)0x1d2e69);
  std::optional<backend::codegen::LastJump>::optional
            ((optional<backend::codegen::LastJump> *)0x1d2e7d);
  *(undefined4 *)((long)in_RDI + 0x20c) = 0;
  *(undefined4 *)(in_RDI + 0x42) = 0;
  *(undefined4 *)((long)in_RDI + 0x214) = 0;
  *(undefined4 *)(in_RDI + 0x43) = 0;
  *(byte *)((long)in_RDI + 0x21c) = local_21 & 1;
  *(undefined4 *)((long)in_RDI + 0x224) = 0;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
               *)in_stack_fffffffffffff598,(key_type *)0x1d2edb);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
              *)in_stack_fffffffffffff598);
  bVar1 = std::operator!=(&local_30,local_48);
  if (bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                  *)in_stack_fffffffffffff5a0);
    local_50 = std::
               any_cast<std::unordered_map<std::__cxx11::string,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>&>
                         ((any *)in_stack_fffffffffffff5a0);
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 *)in_stack_fffffffffffff598,(key_type *)0x1d2f74);
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                *)in_stack_fffffffffffff598);
    bVar1 = std::__detail::operator!=(&local_58,&local_60);
    if (bVar1) {
      local_61 = 0;
      AixLog::operator<<(in_stack_fffffffffffff6a0,(Severity *)in_stack_fffffffffffff698);
      AixLog::Tag::Tag((Tag *)0x1d2ff4);
      AixLog::operator<<(in_stack_fffffffffffff5d0,(Tag *)in_stack_fffffffffffff5c8);
      local_b8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      AixLog::Timestamp::Timestamp(local_b0,&local_b8);
      AixLog::operator<<(in_stack_fffffffffffff630,in_stack_fffffffffffff628);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,
                 (allocator<char> *)in_stack_fffffffffffff5d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,
                 (allocator<char> *)in_stack_fffffffffffff5d0);
      AixLog::Function::Function
                (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,
                 (string *)in_stack_fffffffffffff5a0,(size_t)in_stack_fffffffffffff598);
      poVar3 = AixLog::operator<<(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
      poVar3 = std::operator<<(poVar3,"Found order map for ");
      poVar3 = std::operator<<(poVar3,(string *)(local_10 + 8));
      poVar3 = std::operator<<(poVar3," with ");
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_true>
                             *)0x1d316d);
      sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&ppVar2->second);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar8);
      poVar3 = std::operator<<(poVar3," elements");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      AixLog::Function::~Function(in_stack_fffffffffffff5a0);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator(&local_159);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator(&local_131);
      AixLog::Timestamp::~Timestamp(local_b0);
      AixLog::Tag::~Tag((Tag *)0x1d3222);
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_true>
                             *)0x1d322f);
      local_168 = &ppVar2->second;
      local_178 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     in_stack_fffffffffffff598);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)in_stack_fffffffffffff5a0,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)in_stack_fffffffffffff598);
      local_180 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     in_stack_fffffffffffff598);
      local_188 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     in_stack_fffffffffffff598);
      local_190 = (uint *)std::vector<unsigned_int,std::allocator<unsigned_int>>::
                          insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     in_stack_fffffffffffff5e0,in_stack_fffffffffffff5f8,
                                     in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
    }
    else {
      local_191 = 0;
      AixLog::operator<<(in_stack_fffffffffffff6a0,(Severity *)in_stack_fffffffffffff698);
      AixLog::Tag::Tag((Tag *)0x1d3416);
      AixLog::operator<<(in_stack_fffffffffffff5d0,(Tag *)in_stack_fffffffffffff5c8);
      local_1e8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      AixLog::Timestamp::Timestamp(local_1e0,&local_1e8);
      AixLog::operator<<(in_stack_fffffffffffff630,in_stack_fffffffffffff628);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,
                 (allocator<char> *)in_stack_fffffffffffff5d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,
                 (allocator<char> *)in_stack_fffffffffffff5d0);
      AixLog::Function::Function
                (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,
                 (string *)in_stack_fffffffffffff5a0,(size_t)in_stack_fffffffffffff598);
      poVar3 = AixLog::operator<<(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
      poVar3 = std::operator<<(poVar3,"Cannot find order map for ");
      poVar3 = std::operator<<(poVar3,(string *)(local_10 + 8));
      poVar3 = std::operator<<(poVar3," (1)");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      AixLog::Function::~Function(in_stack_fffffffffffff5a0);
      std::__cxx11::string::~string(local_288);
      std::allocator<char>::~allocator(&local_289);
      std::__cxx11::string::~string(local_260);
      std::allocator<char>::~allocator(&local_261);
      AixLog::Timestamp::~Timestamp(local_1e0);
      AixLog::Tag::~Tag((Tag *)0x1d35f3);
      local_298 = local_10 + 0x68;
      local_2a0._M_node =
           (_Base_ptr)
           std::
           map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    *)in_stack_fffffffffffff598);
      local_2a8._M_node =
           (_Base_ptr)
           std::
           map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)in_stack_fffffffffffff598);
      while (bVar1 = std::operator!=(&local_2a0,&local_2a8), bVar1) {
        local_2b0 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator*
                              ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                               0x1d365c);
        local_2b4 = local_2b0->first;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff5a0,
                   (value_type *)in_stack_fffffffffffff598);
        std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                   in_stack_fffffffffffff5a0);
      }
    }
  }
  else {
    local_2b5 = 0;
    AixLog::operator<<(in_stack_fffffffffffff6a0,(Severity *)in_stack_fffffffffffff698);
    AixLog::Tag::Tag((Tag *)0x1d37c6);
    AixLog::operator<<(in_stack_fffffffffffff5d0,(Tag *)in_stack_fffffffffffff5c8);
    local_308.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_300,&local_308);
    AixLog::operator<<(in_stack_fffffffffffff630,in_stack_fffffffffffff628);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,
               (allocator<char> *)in_stack_fffffffffffff5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,
               (allocator<char> *)in_stack_fffffffffffff5d0);
    AixLog::Function::Function
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,
               (string *)in_stack_fffffffffffff5a0,(size_t)in_stack_fffffffffffff598);
    poVar3 = AixLog::operator<<(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
    in_stack_fffffffffffff6a0 = std::operator<<(poVar3,"Cannot find order map for ");
    in_stack_fffffffffffff698 = std::operator<<(in_stack_fffffffffffff6a0,(string *)(local_10 + 8));
    poVar3 = std::operator<<(in_stack_fffffffffffff698," (2)");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function(in_stack_fffffffffffff5a0);
    std::__cxx11::string::~string(local_3a8);
    std::allocator<char>::~allocator(&local_3a9);
    std::__cxx11::string::~string(local_380);
    std::allocator<char>::~allocator(&local_381);
    AixLog::Timestamp::~Timestamp(local_300);
    AixLog::Tag::~Tag((Tag *)0x1d39a3);
    local_3b8 = local_10 + 0x68;
    local_3c0._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)in_stack_fffffffffffff598);
    local_3c8._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_fffffffffffff598);
    while (bVar1 = std::operator!=(&local_3c0,&local_3c8), bVar1) {
      local_3d0 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator*
                            ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                             0x1d3a0c);
      local_3d4 = local_3d0->first;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff5a0,
                 (value_type *)in_stack_fffffffffffff598);
      std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                 in_stack_fffffffffffff5a0);
    }
  }
  local_3e0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
               *)in_stack_fffffffffffff598,(key_type *)0x1d3b52);
  local_3e8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
              *)in_stack_fffffffffffff598);
  bVar1 = std::operator!=(&local_3e0,&local_3e8);
  if (bVar1) {
    local_3e9 = 0;
    AixLog::operator<<(in_stack_fffffffffffff6a0,(Severity *)in_stack_fffffffffffff698);
    AixLog::Tag::Tag((Tag *)0x1d3bd2);
    AixLog::operator<<(in_stack_fffffffffffff5d0,(Tag *)in_stack_fffffffffffff5c8);
    local_440.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_438,&local_440);
    AixLog::operator<<(in_stack_fffffffffffff630,in_stack_fffffffffffff628);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,
               (allocator<char> *)in_stack_fffffffffffff5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,
               (allocator<char> *)in_stack_fffffffffffff5d0);
    AixLog::Function::Function
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,
               (string *)in_stack_fffffffffffff5a0,(size_t)in_stack_fffffffffffff598);
    poVar3 = AixLog::operator<<(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
    poVar3 = std::operator<<(poVar3,"Found inline hint in extra data");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function(in_stack_fffffffffffff5a0);
    std::__cxx11::string::~string(local_4e0);
    std::allocator<char>::~allocator(&local_4e1);
    std::__cxx11::string::~string(local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
    AixLog::Timestamp::~Timestamp(local_438);
    AixLog::Tag::~Tag((Tag *)0x1d3d6e);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                  *)in_stack_fffffffffffff5a0);
    std::
    any_cast<std::unordered_map<std::__cxx11::string,std::map<unsigned_int,arm::ConditionCode,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,arm::ConditionCode>>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<unsigned_int,arm::ConditionCode,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,arm::ConditionCode>>>>>>&>
              ((any *)in_stack_fffffffffffff5a0);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>_>_>
    ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>_>_>
          *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
    std::
    map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
    ::operator=((map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
                 *)in_stack_fffffffffffff5a0,
                (map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
                 *)in_stack_fffffffffffff598);
    local_4e2 = 0;
    AixLog::operator<<(in_stack_fffffffffffff6a0,(Severity *)in_stack_fffffffffffff698);
    AixLog::Tag::Tag((Tag *)0x1d3e05);
    poVar3 = AixLog::operator<<(in_stack_fffffffffffff5d0,(Tag *)in_stack_fffffffffffff5c8);
    local_538.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_530,&local_538);
    timestamp = (Timestamp *)AixLog::operator<<(poVar3,in_stack_fffffffffffff628);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,
               (allocator<char> *)in_stack_fffffffffffff5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,
               (allocator<char> *)in_stack_fffffffffffff5d0);
    AixLog::Function::Function
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,
               (string *)in_stack_fffffffffffff5a0,(size_t)in_stack_fffffffffffff598);
    poVar4 = AixLog::operator<<(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
    poVar4 = std::operator<<(poVar4,"Inline hint has ");
    sVar5 = std::
            map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
            ::size((map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
                    *)0x1d3f3b);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
    std::operator<<(poVar4," items: ");
    AixLog::Function::~Function(in_stack_fffffffffffff5a0);
    std::__cxx11::string::~string(local_5d8);
    std::allocator<char>::~allocator(&local_5d9);
    std::__cxx11::string::~string(local_5b0);
    std::allocator<char>::~allocator(&local_5b1);
    AixLog::Timestamp::~Timestamp(local_530);
    AixLog::Tag::~Tag((Tag *)0x1d3fbd);
    local_5e8 = in_RDI + 0x37;
    local_5f0._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
         ::begin((map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
                  *)in_stack_fffffffffffff598);
    local_5f8._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
         ::end((map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
                *)in_stack_fffffffffffff598);
    while (bVar1 = std::operator!=(&local_5f0,&local_5f8), bVar1) {
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_arm::ConditionCode>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_unsigned_int,_arm::ConditionCode>_> *)
                          0x1d4028);
      local_600 = *ppVar6;
      local_601 = 0;
      AixLog::operator<<(in_stack_fffffffffffff6a0,(Severity *)in_stack_fffffffffffff698);
      AixLog::Tag::Tag((Tag *)0x1d4063);
      AixLog::operator<<(in_stack_fffffffffffff5d0,(Tag *)in_stack_fffffffffffff5c8);
      local_658.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      AixLog::Timestamp::Timestamp(local_650,&local_658);
      AixLog::operator<<(poVar3,timestamp);
      in_stack_fffffffffffff5e0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,
                 (allocator<char> *)in_stack_fffffffffffff5d0);
      in_stack_fffffffffffff5d8 = &local_6f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,
                 (allocator<char> *)in_stack_fffffffffffff5d0);
      AixLog::Function::Function
                (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,
                 (string *)in_stack_fffffffffffff5a0,(size_t)in_stack_fffffffffffff598);
      in_stack_fffffffffffff5d0 =
           AixLog::operator<<(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
      in_stack_fffffffffffff5c8 =
           (Function *)std::ostream::operator<<(in_stack_fffffffffffff5d0,local_600.first);
      std::operator<<((ostream *)in_stack_fffffffffffff5c8," ");
      AixLog::Function::~Function(in_stack_fffffffffffff5a0);
      std::__cxx11::string::~string(local_6f8);
      std::allocator<char>::~allocator(&local_6f9);
      std::__cxx11::string::~string((string *)(local_6d1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_6d1);
      AixLog::Timestamp::~Timestamp(local_650);
      AixLog::Tag::~Tag((Tag *)0x1d41d8);
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_arm::ConditionCode>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_unsigned_int,_arm::ConditionCode>_> *)
                 in_stack_fffffffffffff5a0);
    }
    local_6fa = 0;
    AixLog::operator<<(in_stack_fffffffffffff6a0,(Severity *)in_stack_fffffffffffff698);
    AixLog::Tag::Tag((Tag *)0x1d44d2);
    AixLog::operator<<(in_stack_fffffffffffff5d0,(Tag *)in_stack_fffffffffffff5c8);
    local_750.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_748,&local_750);
    this_00 = (Function *)AixLog::operator<<(poVar3,timestamp);
    name = (string *)local_7c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,
               (allocator<char> *)in_stack_fffffffffffff5d0);
    this_01 = (Function *)local_7f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,
               (allocator<char> *)in_stack_fffffffffffff5d0);
    AixLog::Function::Function(this_00,name,(string *)this_01,(size_t)in_stack_fffffffffffff598);
    poVar3 = AixLog::operator<<(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function(this_01);
    std::__cxx11::string::~string((string *)(local_7f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_7f1);
    std::__cxx11::string::~string((string *)(local_7c9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_7c9);
    AixLog::Timestamp::~Timestamp(local_748);
    AixLog::Tag::~Tag((Tag *)0x1d462d);
  }
  peVar7 = std::
           __shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d4728);
  sVar8 = std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::size(&peVar7->params);
  *(int *)(in_RDI + 0x44) = (int)sVar8;
  return;
}

Assistant:

Codegen(mir::inst::MirFunction& func, mir::inst::MirPackage& package,
          std::map<std::string, std::any>& extra_data,
          bool enable_cond_exec = true)
      : func(func),
        package(package),
        extra_data(extra_data),
        inst(),
        reg_map(),
        fixed_vars(),
        var_collapse(),
        bb_ordering(),
        enable_cond_exec(enable_cond_exec) {
    {
      // Calculate ordering
      auto any_ordering =
          extra_data.find(optimization::BASIC_BLOCK_ORDERING_DATA_NAME);
      if (any_ordering != extra_data.end()) {
        auto& order_map = std::any_cast<optimization::BasicBlockOrderingType&>(
            any_ordering->second);
        auto o = order_map.find(func.name);
        if (o != order_map.end()) {
          LOG(TRACE) << "Found order map for " << func.name << " with "
                     << o->second.size() << " elements" << std::endl;
          auto& ordering = o->second;
          this->bb_ordering.insert(bb_ordering.end(), ordering.begin(),
                                   ordering.end());
        } else {
          LOG(TRACE) << "Cannot find order map for " << func.name << " (1)"
                     << std::endl;
          for (auto& a : func.basic_blks) {
            bb_ordering.push_back(a.first);
          }
        }
      } else {
        LOG(TRACE) << "Cannot find order map for " << func.name << " (2)"
                   << std::endl;
        for (auto& a : func.basic_blks) {
          bb_ordering.push_back(a.first);
        }
      }
    }
    auto inline_hint = extra_data.find(optimization::inline_blks);
    if (inline_hint != extra_data.end()) {
      LOG(TRACE) << "Found inline hint in extra data" << std::endl;

      this->inline_hint =
          std::any_cast<optimization::InlineBlksType&>(inline_hint->second)
              .at(func.name);

      LOG(TRACE) << "Inline hint has " << this->inline_hint.size()
                 << " items: ";
      for (auto i : this->inline_hint) LOG(TRACE) << i.first << " ";
      LOG(TRACE) << std::endl;
    }
    param_size = func.type->params.size();
  }